

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_disk_io.cpp
# Opt level: O3

void __thiscall
libtorrent::posix_disk_io::posix_disk_io
          (posix_disk_io *this,io_context *ios,settings_interface *sett,counters *cnt)

{
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)&PTR_new_torrent_004e2d18;
  (this->m_torrents).
  super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  .
  super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_torrents).
  super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  .
  super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_torrents).
  super_vector<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  .
  super__Vector_base<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>,_std::allocator<std::unique_ptr<libtorrent::aux::posix_storage,_std::default_delete<libtorrent::aux::posix_storage>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_free_slots).m_free_slots.
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).m_free_slots.
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_free_slots).m_free_slots.
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_settings = sett;
  aux::disk_buffer_pool::disk_buffer_pool(&this->m_buffer_pool,ios);
  this->m_stats_counters = cnt;
  this->m_ios = ios;
  aux::disk_buffer_pool::set_settings(&this->m_buffer_pool,this->m_settings);
  return;
}

Assistant:

posix_disk_io(io_context& ios, settings_interface const& sett, counters& cnt)
			: m_settings(sett)
			, m_buffer_pool(ios)
			, m_stats_counters(cnt)
			, m_ios(ios)
		{
			settings_updated();
		}